

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O1

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<double,long>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          long *out_value)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  byte bVar4;
  double *pdVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar6 = *(uint *)&this->num_components_;
  bVar4 = out_num_components;
  if ((byte)uVar6 < out_num_components) {
    bVar4 = (byte)uVar6;
  }
  bVar8 = bVar4 == 0;
  if (bVar8) {
LAB_0014c705:
    if ((byte)uVar6 < out_num_components) {
      memset(out_value + (uVar6 & 0xff),0,
             (ulong)((uint)out_num_components + ~(uVar6 & 0xff)) * 8 + 8);
    }
  }
  else {
    pdVar5 = (double *)
             ((this->buffer_->data_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start +
             this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_);
    pdVar3 = (double *)
             (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar5 < pdVar3) {
      bVar2 = this->normalized_;
      uVar7 = 1;
      do {
        dVar1 = *pdVar5;
        if (9.223372036854776e+18 <= dVar1) {
          return bVar8;
        }
        if ((bVar2 & 1U) != 0) {
          return bVar8;
        }
        if (dVar1 < -9.223372036854776e+18) {
          return bVar8;
        }
        if (0x7fefffffffffffff < (ulong)ABS(dVar1)) {
          return bVar8;
        }
        out_value[uVar7 - 1] = (long)dVar1;
        uVar6 = *(uint *)&this->num_components_;
        bVar4 = (byte)uVar6;
        if (out_num_components <= (byte)uVar6) {
          bVar4 = out_num_components;
        }
        bVar8 = bVar4 <= uVar7;
        if (bVar8) goto LAB_0014c705;
        pdVar5 = pdVar5 + 1;
        uVar7 = uVar7 + 1;
      } while (pdVar5 < pdVar3);
    }
  }
  return bVar8;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }